

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::Remove(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
         *this,void *key,PinRecord *pOut)

{
  EntryType *current;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar1;
  uint uVar2;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar3;
  
  uVar2 = HashKeyToBucket(this,key);
  ppSVar1 = this->table + uVar2;
  do {
    ppSVar3 = ppSVar1;
    current = *ppSVar3;
    if (current == (EntryType *)0x0) {
      return;
    }
    ppSVar1 = &current->next;
  } while (current->key != key);
  *ppSVar3 = current->next;
  if (pOut != (PinRecord *)0x0) {
    pOut->refCount = (current->value).refCount;
    pOut->stackBackTraces = (current->value).stackBackTraces;
  }
  FreeEntry(this,current);
  if (this->stats == (DictionaryStats *)0x0) {
    return;
  }
  DictionaryStats::Remove(this->stats,this->table[uVar2] == (EntryType *)0x0);
  return;
}

Assistant:

void Remove(TKey key, TData* pOut)
    {
        uint val = HashKeyToBucket(key);
        EntryType **prev=&table[val];
        for (EntryType * current = *prev ; current != nullptr; current = current->next)
        {
            if (Comparer<TKey>::Equals(key, current->key))
            {
                *prev = current->next;
                if (pOut != nullptr)
                {
                    (*pOut) = current->value;
                }

                FreeEntry(current);
#if PROFILE_DICTIONARY
                if (stats)
                    stats->Remove(table[val] == nullptr);
#endif
                break;
            }
            prev = &current->next;
        }
    }